

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TCPServer.cpp
# Opt level: O1

void __thiscall SocketPP::TCPServer::disconnectAllStreams(TCPServer *this)

{
  pointer pTVar1;
  int iVar2;
  pointer pTVar3;
  
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)&this->streamMutex_);
  if (iVar2 == 0) {
    pTVar1 = (this->connectedStreams_).
             super__Vector_base<SocketPP::TCPStream,_std::allocator<SocketPP::TCPStream>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (pTVar3 = (this->connectedStreams_).
                  super__Vector_base<SocketPP::TCPStream,_std::allocator<SocketPP::TCPStream>_>.
                  _M_impl.super__Vector_impl_data._M_start; pTVar3 != pTVar1; pTVar3 = pTVar3 + 1) {
      (*(this->super_SocketServer).super_Socket._vptr_Socket[1])(this,(ulong)(uint)pTVar3->fd);
    }
    pTVar3 = (this->connectedStreams_).
             super__Vector_base<SocketPP::TCPStream,_std::allocator<SocketPP::TCPStream>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((this->connectedStreams_).
        super__Vector_base<SocketPP::TCPStream,_std::allocator<SocketPP::TCPStream>_>._M_impl.
        super__Vector_impl_data._M_finish != pTVar3) {
      (this->connectedStreams_).
      super__Vector_base<SocketPP::TCPStream,_std::allocator<SocketPP::TCPStream>_>._M_impl.
      super__Vector_impl_data._M_finish = pTVar3;
    }
    pthread_mutex_unlock((pthread_mutex_t *)&this->streamMutex_);
    return;
  }
  std::__throw_system_error(iVar2);
}

Assistant:

void TCPServer::disconnectAllStreams() {
    std::lock_guard<std::mutex> lockStream(streamMutex_);

    for (auto stream:connectedStreams_) {
        onDisconnected(stream.fd);
    }
    connectedStreams_.clear();
}